

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cfg.hpp
# Opt level: O1

void __thiscall
diligent_spirv_cross::CFG::
walk_from<diligent_spirv_cross::Compiler::analyze_variable_scope(diligent_spirv_cross::SPIRFunction&,diligent_spirv_cross::Compiler::AnalyzeVariableScopeAccessHandler&)::__0>
          (CFG *this,
          unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
          *seen_blocks,uint32_t block,anon_class_16_2_2fc8764d *op)

{
  ulong uVar1;
  _Hash_node_base *p_Var2;
  size_t sVar3;
  uint *puVar4;
  size_type sVar5;
  SmallVector<unsigned_int,_8UL> *pSVar6;
  ulong uVar7;
  long lVar8;
  __node_base_ptr p_Var9;
  __node_base_ptr p_Var10;
  __hashtable *__h;
  __node_gen_type __node_gen;
  uint32_t local_3c;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  *local_38;
  
  local_3c = block;
  sVar5 = ::std::
          _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
          ::count(&seen_blocks->_M_h,&local_3c);
  if (sVar5 == 0) {
    local_38 = seen_blocks;
    ::std::
    _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
    ::
    _M_insert<unsigned_int_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_int,false>>>>
              (seen_blocks,
               (_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                *)&local_3c);
    uVar1 = (op->blocks->_M_h)._M_bucket_count;
    uVar7 = (ulong)local_3c % uVar1;
    p_Var9 = (op->blocks->_M_h)._M_buckets[uVar7];
    p_Var10 = (__node_base_ptr)0x0;
    if ((p_Var9 != (__node_base_ptr)0x0) &&
       (p_Var2 = p_Var9->_M_nxt, p_Var10 = p_Var9, *(uint *)&p_Var9->_M_nxt[1]._M_nxt != local_3c))
    {
      while (p_Var9 = p_Var2, p_Var2 = p_Var9->_M_nxt, p_Var2 != (_Hash_node_base *)0x0) {
        p_Var10 = (__node_base_ptr)0x0;
        if (((ulong)*(uint *)&p_Var2[1]._M_nxt % uVar1 != uVar7) ||
           (p_Var10 = p_Var9, *(uint *)&p_Var2[1]._M_nxt == local_3c)) goto LAB_007c76d0;
      }
      p_Var10 = (__node_base_ptr)0x0;
    }
LAB_007c76d0:
    if ((p_Var10 != (__node_base_ptr)0x0) && (p_Var10->_M_nxt != (_Hash_node_base *)0x0)) {
      *op->static_loop_init = false;
    }
    pSVar6 = get_succeeding_edges(this,local_3c);
    sVar3 = (pSVar6->super_VectorView<unsigned_int>).buffer_size;
    if (sVar3 != 0) {
      puVar4 = (pSVar6->super_VectorView<unsigned_int>).ptr;
      lVar8 = 0;
      do {
        walk_from<diligent_spirv_cross::Compiler::analyze_variable_scope(diligent_spirv_cross::SPIRFunction&,diligent_spirv_cross::Compiler::AnalyzeVariableScopeAccessHandler&)::__0>
                  (this,seen_blocks,*(uint32_t *)((long)puVar4 + lVar8),op);
        lVar8 = lVar8 + 4;
      } while (sVar3 << 2 != lVar8);
    }
  }
  return;
}

Assistant:

void walk_from(std::unordered_set<uint32_t> &seen_blocks, uint32_t block, const Op &op) const
	{
		if (seen_blocks.count(block))
			return;
		seen_blocks.insert(block);

		if (op(block))
		{
			for (auto b : get_succeeding_edges(block))
				walk_from(seen_blocks, b, op);
		}
	}